

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  locale *plVar5;
  basic_format_specs<char> *pbVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  uint uVar10;
  numpunct *pnVar11;
  buffer_appender<char> bVar12;
  uint uVar13;
  int iVar14;
  char *pcVar15;
  ulong uVar16;
  buffer<char> *buf;
  uint uVar17;
  uint uVar18;
  long *plVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  ulong size;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  long *local_2a8;
  long local_2a0;
  long local_298 [2];
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *local_288;
  char *local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  plVar5 = (locale *)(this->locale).locale_;
  if (plVar5 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar5);
  }
  pnVar11 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  (**(code **)(*(long *)pnVar11 + 0x20))(&local_2a8,pnVar11);
  std::locale::~locale((locale *)&local_248);
  if (local_2a0 == 0) {
    on_dec(this);
    goto LAB_0011a66b;
  }
  plVar5 = (locale *)(this->locale).locale_;
  if (plVar5 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar5);
  }
  pnVar11 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  cVar9 = (**(code **)(*(long *)pnVar11 + 0x18))(pnVar11);
  std::locale::~locale((locale *)&local_248);
  if (cVar9 == '\0') {
    on_dec(this);
    goto LAB_0011a66b;
  }
  uVar18 = this->abs_value;
  uVar17 = 0x1f;
  if ((uVar18 | 1) != 0) {
    for (; (uVar18 | 1) >> uVar17 == 0; uVar17 = uVar17 - 1) {
    }
  }
  uVar4 = *(ushort *)(bsr2log10(int)::data + (ulong)uVar17 * 2);
  bVar8 = uVar18 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new + (ulong)uVar4 * 4);
  uVar24 = (uint)uVar4 - (uint)bVar8;
  plVar19 = local_2a8;
  uVar17 = uVar24;
  uVar10 = uVar24;
  if (local_2a0 == 0) {
LAB_0011a431:
    uVar21 = uVar10;
    uVar13 = uVar17;
    if (plVar19 == (long *)((long)local_2a8 + local_2a0)) goto LAB_0011a43c;
  }
  else {
    uVar21 = uVar24 + (int)local_2a0;
    lVar23 = local_2a0;
    do {
      cVar2 = (char)*plVar19;
      uVar13 = uVar17 - (int)cVar2;
      if ((uVar13 == 0 || (int)uVar17 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82))
      goto LAB_0011a431;
      uVar10 = uVar10 + 1;
      plVar19 = (long *)((long)plVar19 + 1);
      lVar23 = lVar23 + -1;
      uVar17 = uVar13;
    } while (lVar23 != 0);
LAB_0011a43c:
    uVar21 = (int)(uVar13 - 1) / (int)*(char *)((long)local_2a8 + local_2a0 + -1) + uVar21;
  }
  pcVar15 = local_278 + (int)uVar24;
  uVar17 = uVar18;
  if (99 < uVar18) {
    do {
      uVar18 = uVar17 / 100;
      *(undefined2 *)(pcVar15 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar17 % 100) * 2);
      pcVar15 = pcVar15 + -2;
      bVar7 = 9999 < uVar17;
      uVar17 = uVar17 / 100;
    } while (bVar7);
  }
  if (uVar18 < 10) {
    pcVar15[-1] = (byte)uVar18 | 0x30;
  }
  else {
    *(undefined2 *)(pcVar15 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar18 * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00147f10;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar21 = uVar21 + this->prefix_size;
  if (-1 < (int)uVar21) {
    size = (ulong)uVar21;
    if (500 < uVar21) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,size);
    }
    local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
    if (size <= local_248.super_buffer<char>.capacity_) {
      local_248.super_buffer<char>.size_ = size;
    }
    pcVar15 = local_248.super_buffer<char>.ptr_ + (size - 1);
    if (1 < (int)uVar24) {
      uVar20 = (ulong)uVar24;
      iVar22 = ((uint)uVar4 - (uint)bVar8) + 1;
      iVar14 = 0;
      plVar19 = local_2a8;
      do {
        uVar20 = uVar20 - 1;
        pcVar1 = pcVar15 + -1;
        *pcVar15 = local_278[uVar20 & 0xffffffff];
        cVar2 = (char)*plVar19;
        if (0 < cVar2) {
          iVar14 = iVar14 + 1;
          if ((cVar2 != '\x7f') && (iVar14 % (int)cVar2 == 0)) {
            if ((long *)((long)plVar19 + 1) != (long *)((long)local_2a8 + local_2a0)) {
              iVar14 = 0;
              plVar19 = (long *)((long)plVar19 + 1);
            }
            pcVar15[-1] = cVar9;
            pcVar1 = pcVar15 + -2;
          }
        }
        pcVar15 = pcVar1;
        iVar22 = iVar22 + -1;
      } while (2 < iVar22);
    }
    *pcVar15 = local_278[0];
    if (this->prefix_size != 0) {
      pcVar15[-1] = '-';
    }
    pbVar6 = this->specs;
    uVar20 = (ulong)pbVar6->width;
    if (-1 < (long)uVar20) {
      local_280 = local_248.super_buffer<char>.ptr_;
      uVar16 = 0;
      if (size <= uVar20) {
        uVar16 = uVar20 - size;
      }
      bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)((byte)pbVar6->field_0x9 & 0xf));
      local_288 = this;
      if (*(ulong *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                           container + 0x18) <
          *(long *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                          container + 0x10) + size + (pbVar6->fill).size_ * uVar16) {
        (*(code *)**(undefined8 **)
                    bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      uVar20 = uVar16 >> (bVar3 & 0x3f);
      bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar12,uVar20,&pbVar6->fill);
      bVar12 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                         (local_280,local_280 + size,bVar12);
      bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>
                         (bVar12,uVar16 - uVar20,&pbVar6->fill);
      (local_288->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
      }
LAB_0011a66b:
      if (local_2a8 != local_298) {
        operator_delete(local_2a8,local_298[0] + 1);
      }
      return;
    }
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/spdlog/fmt/bundled/core.h"
              ,0x146,"negative value");
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }